

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgTypes.cpp
# Opt level: O1

HaI32 dgVertexListToIndexList
                (HaF32 *vertList,HaI32 strideInBytes,HaI32 floatSizeInBytes,
                HaI32 unsignedSizeInBytes,HaI32 vertexCount,HaI32 *indexList,HaF32 tolerance)

{
  uint uVar1;
  HaF64 *vertList_00;
  uint uVar2;
  ulong uVar3;
  HaF64 *pHVar4;
  HaF32 *pHVar5;
  ulong uVar6;
  
  if (unsignedSizeInBytes != 0) {
    __assert_fail("!unsignedSizeInBytes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgTypes.cpp"
                  ,0x195,
                  "hacd::HaI32 dgVertexListToIndexList(hacd::HaF32 *const, hacd::HaI32, hacd::HaI32, hacd::HaI32, hacd::HaI32, hacd::HaI32 *const, hacd::HaF32)"
                 );
  }
  uVar2 = strideInBytes >> 2;
  vertList_00 = (HaF64 *)malloc((long)(int)(uVar2 * vertexCount * 8));
  if (-1 < (int)(uVar2 * vertexCount)) {
    if (0 < vertexCount) {
      uVar3 = 0;
      pHVar5 = vertList;
      pHVar4 = vertList_00;
      do {
        if (0 < (int)uVar2) {
          uVar6 = 0;
          do {
            pHVar4[uVar6] = (HaF64)(double)(float)pHVar5[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar2 != uVar6);
        }
        uVar3 = uVar3 + 1;
        pHVar4 = pHVar4 + (int)uVar2;
        pHVar5 = pHVar5 + (int)uVar2;
      } while (uVar3 != (uint)vertexCount);
    }
    uVar1 = dgVertexListToIndexList
                      (vertList_00,uVar2 * 8,floatSizeInBytes >> 2,vertexCount,indexList,
                       (HaF64)(double)(float)tolerance);
    if (0 < (int)uVar1) {
      uVar3 = 0;
      pHVar4 = vertList_00;
      do {
        if (0 < (int)uVar2) {
          uVar6 = 0;
          do {
            vertList[uVar6] = (HaF32)(float)(double)pHVar4[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar2 != uVar6);
        }
        uVar3 = uVar3 + 1;
        vertList = vertList + (int)uVar2;
        pHVar4 = pHVar4 + (int)uVar2;
      } while (uVar3 != uVar1);
    }
    free(vertList_00);
    return uVar1;
  }
  __assert_fail("(entry < m_size) || ((m_size == 0) && (entry == 0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                ,0x60,"T &dgStack<double>::operator[](hacd::HaI32) [T = double]");
}

Assistant:

hacd::HaI32 dgVertexListToIndexList (hacd::HaF32* const vertList, hacd::HaI32 strideInBytes, hacd::HaI32 floatSizeInBytes, hacd::HaI32 unsignedSizeInBytes, hacd::HaI32 vertexCount, hacd::HaI32* const indexList, hacd::HaF32 tolerance)
{
	HACD_FORCE_PARAMETER_REFERENCE(unsignedSizeInBytes);
	hacd::HaI32 stride = strideInBytes / sizeof (hacd::HaF32);

	HACD_ASSERT (!unsignedSizeInBytes);
	dgStack<hacd::HaF64> pool(vertexCount * stride);

	hacd::HaI32 floatCount = floatSizeInBytes / sizeof (hacd::HaF32);

	hacd::HaF64* const data = &pool[0];
	for (hacd::HaI32 i = 0; i < vertexCount; i ++) {

		hacd::HaF64* const dst = &data[i * stride];
		hacd::HaF32* const src = &vertList[i * stride];
		for (hacd::HaI32 j = 0; j < stride; j ++) {
			dst[j] = src[j];
		}
	}

	hacd::HaI32 count = dgVertexListToIndexList (data, stride * sizeof (hacd::HaF64), floatCount, vertexCount, indexList, hacd::HaF64 (tolerance));
	for (hacd::HaI32 i = 0; i < count; i ++) {
		hacd::HaF64* const src = &data[i * stride];
		hacd::HaF32* const dst = &vertList[i * stride];
		for (hacd::HaI32 j = 0; j < stride; j ++) {
			dst[j] = hacd::HaF32 (src[j]);
		}
	}
	
	return count;
}